

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_newnode(SQRex *exp,SQRexNodeType type)

{
  long lVar1;
  void *pvVar2;
  undefined8 *puVar3;
  int in_ESI;
  long in_RDI;
  SQInteger newid;
  SQInteger oldsize;
  SQRexNode n;
  SQUnsignedInteger in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = -1;
  if (in_ESI == 0x102) {
    local_20 = *(long *)(in_RDI + 0x40);
    *(long *)(in_RDI + 0x40) = local_20 + 1;
  }
  if (*(long *)(in_RDI + 0x30) < *(long *)(in_RDI + 0x38) + 1) {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) << 1;
    pvVar2 = sq_realloc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x152010);
    *(void **)(in_RDI + 0x28) = pvVar2;
  }
  lVar1 = *(long *)(in_RDI + 0x38);
  *(long *)(in_RDI + 0x38) = lVar1 + 1;
  puVar3 = (undefined8 *)(*(long *)(in_RDI + 0x28) + lVar1 * 0x20);
  *puVar3 = CONCAT44(uStack_2c,in_ESI);
  puVar3[1] = 0xffffffffffffffff;
  puVar3[2] = local_20;
  puVar3[3] = 0xffffffffffffffff;
  return *(long *)(in_RDI + 0x38) + -1;
}

Assistant:

static SQInteger sqstd_rex_newnode(SQRex *exp, SQRexNodeType type)
{
    SQRexNode n;
    n.type = type;
    n.next = n.right = n.left = -1;
    if(type == OP_EXPR)
        n.right = exp->_nsubexpr++;
    if(exp->_nallocated < (exp->_nsize + 1)) {
        SQInteger oldsize = exp->_nallocated;
        exp->_nallocated *= 2;
        exp->_nodes = (SQRexNode *)sq_realloc(exp->_nodes, oldsize * sizeof(SQRexNode) ,exp->_nallocated * sizeof(SQRexNode));
    }
    exp->_nodes[exp->_nsize++] = n;
    SQInteger newid = exp->_nsize - 1;
    return (SQInteger)newid;
}